

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest::WriteString
          (IoTest *this,ZeroCopyOutputStream *output,string *str)

{
  int iVar1;
  char *message;
  char *in_R9;
  int out_size;
  void *out;
  int local_7c;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  
  iVar1 = (*(this->super_Test)._vptr_Test[2])(this,&local_70,&local_7c);
  if ((char)iVar1 != '\0') {
    do {
      local_78.data_._0_4_ = 0;
      testing::internal::CmpHelperGT<int,int>
                ((internal *)local_68,"out_size","0",&local_7c,(int *)&local_78);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        message = anon_var_dwarf_a22956 + 5;
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x93,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
        }
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      iVar1 = (int)str;
      if (iVar1 <= local_7c) {
        memcpy(local_70._M_head_impl,output,(long)iVar1);
        (*(this->super_Test)._vptr_Test[3])(this,(ulong)(uint)(local_7c - iVar1));
        return;
      }
      memcpy(local_70._M_head_impl,output,(long)local_7c);
      output = (ZeroCopyOutputStream *)((long)&output->_vptr_ZeroCopyOutputStream + (long)local_7c);
      str = (string *)(ulong)(uint)(iVar1 - local_7c);
      iVar1 = (*(this->super_Test)._vptr_Test[2])(this,&local_70,&local_7c);
    } while ((char)iVar1 != '\0');
  }
  local_48[0] = (internal)0x0;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_70);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_68,local_48,
             (AssertionResult *)"WriteToOutput(output, str.c_str(), str.size())","false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
             ,199,(char *)CONCAT71(local_68._1_7_,local_68[0]));
  testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_68._1_7_,local_68[0]) != &local_58) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_68._1_7_,local_68[0]),local_58._M_allocated_capacity + 1);
  }
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

void IoTest::WriteString(ZeroCopyOutputStream* output, const std::string& str) {
  EXPECT_TRUE(WriteToOutput(output, str.c_str(), str.size()));
}